

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void copy_slot(lua_State *L,TValue *f,int idx)

{
  GCobj *o_00;
  TValue *pTVar1;
  TValue *o;
  GCfunc *fn;
  int idx_local;
  TValue *f_local;
  lua_State *L_local;
  TValue *o_1;
  
  if (idx == -0x2712) {
    (L->env).gcptr64 = f->u64 & 0x7fffffffffff;
  }
  else if (idx == -0x2711) {
    o_00 = (GCobj *)(L->base[-2].u64 & 0x7fffffffffff);
    if ((o_00->gch).gct != '\b') {
      lj_err_msg(L,LJ_ERR_NOENV);
    }
    (o_00->gch).env.gcptr64 = f->u64 & 0x7fffffffffff;
    if (((0xfffffff6 < ((int)(f->field_4).it >> 0xf) + 4U) &&
        ((*(byte *)((f->u64 & 0x7fffffffffff) + 8) & 3) != 0)) && (((o_00->gch).marked & 4) != 0)) {
      lj_gc_barrierf((global_State *)(L->glref).ptr64,o_00,(GCobj *)(f->u64 & 0x7fffffffffff));
    }
  }
  else {
    pTVar1 = index2adr(L,idx);
    *pTVar1 = *f;
    if ((((idx < -0x2712) && (0xfffffff6 < ((int)(f->field_4).it >> 0xf) + 4U)) &&
        ((*(byte *)((f->u64 & 0x7fffffffffff) + 8) & 3) != 0)) &&
       ((*(byte *)((L->base[-2].u64 & 0x7fffffffffff) + 8) & 4) != 0)) {
      lj_gc_barrierf((global_State *)(L->glref).ptr64,(GCobj *)(L->base[-2].u64 & 0x7fffffffffff),
                     (GCobj *)(f->u64 & 0x7fffffffffff));
    }
  }
  return;
}

Assistant:

static void copy_slot(lua_State *L, TValue *f, int idx)
{
  if (idx == LUA_GLOBALSINDEX) {
    lj_checkapi(tvistab(f), "stack slot %d is not a table", idx);
    /* NOBARRIER: A thread (i.e. L) is never black. */
    setgcref(L->env, obj2gco(tabV(f)));
  } else if (idx == LUA_ENVIRONINDEX) {
    GCfunc *fn = curr_func(L);
    if (fn->c.gct != ~LJ_TFUNC)
      lj_err_msg(L, LJ_ERR_NOENV);
    lj_checkapi(tvistab(f), "stack slot %d is not a table", idx);
    setgcref(fn->c.env, obj2gco(tabV(f)));
    lj_gc_barrier(L, fn, f);
  } else {
    TValue *o = index2adr_check(L, idx);
    copyTV(L, o, f);
    if (idx < LUA_GLOBALSINDEX)  /* Need a barrier for upvalues. */
      lj_gc_barrier(L, curr_func(L), f);
  }
}